

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O2

vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> *
validation_layer::createDestroySet(void)

{
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> *in_RDI;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<validation_layer::ctorsAndDtors> __l_21;
  allocator_type local_5d2;
  allocator_type local_5d1;
  allocator local_5d0;
  allocator local_5cf;
  allocator_type local_5ce;
  allocator local_5cd;
  allocator local_5cc;
  allocator local_5cb;
  allocator_type local_5ca;
  allocator local_5c9;
  allocator_type local_5c8;
  allocator local_5c7;
  allocator_type local_5c6;
  allocator local_5c5;
  allocator_type local_5c4;
  allocator local_5c3;
  allocator local_5c2;
  allocator_type local_5c1;
  allocator local_5c0;
  allocator_type local_5bf;
  allocator local_5be;
  allocator_type local_5bd;
  allocator local_5bc;
  allocator_type local_5bb;
  allocator local_5ba;
  allocator_type local_5b9;
  allocator local_5b8;
  allocator_type local_5b7;
  allocator local_5b6;
  allocator local_5b5;
  allocator_type local_5b4;
  allocator local_5b3;
  allocator_type local_5b2;
  allocator local_5b1;
  allocator_type local_5b0;
  allocator local_5af;
  allocator_type local_5ae;
  allocator local_5ad;
  allocator_type local_5ac;
  allocator local_5ab;
  allocator_type local_5aa;
  allocator local_5a9;
  allocator_type local_5a8;
  allocator local_5a7;
  allocator_type local_5a6;
  allocator local_5a5;
  allocator_type local_5a4;
  allocator local_5a3;
  allocator_type local_5a2;
  allocator local_5a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  ctorsAndDtors local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&local_2c0,"zeContextCreate",&local_5a1);
  __l._M_len = 1;
  __l._M_array = &local_2c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2a0.ctors,__l,&local_5a2);
  std::__cxx11::string::string((string *)&local_3a0,"zeContextDestroy",&local_5a3);
  __l_00._M_len = 1;
  __l_00._M_array = &local_3a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2a0.dtors,__l_00,&local_5a4);
  std::__cxx11::string::string((string *)&local_3c0,"zeCommandQueueCreate",&local_5a5);
  __l_01._M_len = 1;
  __l_01._M_array = &local_3c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_270,__l_01,&local_5a6);
  std::__cxx11::string::string((string *)&local_3e0,"zeCommandQueueDestroy",&local_5a7);
  __l_02._M_len = 1;
  __l_02._M_array = &local_3e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_258,__l_02,&local_5a8);
  std::__cxx11::string::string((string *)&local_400,"zeModuleCreate",&local_5a9);
  __l_03._M_len = 1;
  __l_03._M_array = &local_400;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_240,__l_03,&local_5aa);
  std::__cxx11::string::string((string *)&local_420,"zeModuleDestroy",&local_5ab);
  __l_04._M_len = 1;
  __l_04._M_array = &local_420;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_228,__l_04,&local_5ac);
  std::__cxx11::string::string((string *)&local_440,"zeKernelCreate",&local_5ad);
  __l_05._M_len = 1;
  __l_05._M_array = &local_440;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_210,__l_05,&local_5ae);
  std::__cxx11::string::string((string *)&local_460,"zeKernelDestroy",&local_5af);
  __l_06._M_len = 1;
  __l_06._M_array = &local_460;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f8,__l_06,&local_5b0);
  std::__cxx11::string::string((string *)&local_480,"zeEventPoolCreate",&local_5b1);
  __l_07._M_len = 1;
  __l_07._M_array = &local_480;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e0,__l_07,&local_5b2);
  std::__cxx11::string::string((string *)&local_4a0,"zeEventPoolDestroy",&local_5b3);
  __l_08._M_len = 1;
  __l_08._M_array = &local_4a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c8,__l_08,&local_5b4);
  std::__cxx11::string::string((string *)&local_300,"zeCommandListCreateImmediate",&local_5b5);
  std::__cxx11::string::string(local_2e0,"zeCommandListCreate",&local_5b6);
  __l_09._M_len = 2;
  __l_09._M_array = &local_300;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l_09,&local_5b7);
  std::__cxx11::string::string((string *)&local_4c0,"zeCommandListDestroy",&local_5b8);
  __l_10._M_len = 1;
  __l_10._M_array = &local_4c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_198,__l_10,&local_5b9);
  std::__cxx11::string::string((string *)&local_4e0,"zeEventCreate",&local_5ba);
  __l_11._M_len = 1;
  __l_11._M_array = &local_4e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_180,__l_11,&local_5bb);
  std::__cxx11::string::string((string *)&local_500,"zeEventDestroy",&local_5bc);
  __l_12._M_len = 1;
  __l_12._M_array = &local_500;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_168,__l_12,&local_5bd);
  std::__cxx11::string::string((string *)&local_520,"zeFenceCreate",&local_5be);
  __l_13._M_len = 1;
  __l_13._M_array = &local_520;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,__l_13,&local_5bf);
  std::__cxx11::string::string((string *)&local_540,"zeFenceDestroy",&local_5c0);
  __l_14._M_len = 1;
  __l_14._M_array = &local_540;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l_14,&local_5c1);
  std::__cxx11::string::string((string *)&local_340,"zeImageCreate",&local_5c2);
  std::__cxx11::string::string(local_320,"zeImageViewCreateExt",&local_5c3);
  __l_15._M_len = 2;
  __l_15._M_array = &local_340;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120,__l_15,&local_5c4);
  std::__cxx11::string::string((string *)&local_560,"zeImageDestroy",&local_5c5);
  __l_16._M_len = 1;
  __l_16._M_array = &local_560;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,__l_16,&local_5c6);
  std::__cxx11::string::string((string *)&local_580,"zeSamplerCreate",&local_5c7);
  __l_17._M_len = 1;
  __l_17._M_array = &local_580;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f0,__l_17,&local_5c8);
  std::__cxx11::string::string((string *)&local_5a0,"zeSamplerDestroy",&local_5c9);
  __l_18._M_len = 1;
  __l_18._M_array = &local_5a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,__l_18,&local_5ca);
  std::__cxx11::string::string((string *)&local_90,"zeMemAllocDevice",&local_5cb);
  std::__cxx11::string::string(local_70,"zeMemAllocHost",&local_5cc);
  std::__cxx11::string::string(local_50,"zeMemAllocShared",&local_5cd);
  __l_19._M_len = 3;
  __l_19._M_array = &local_90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_19,&local_5ce);
  std::__cxx11::string::string((string *)&local_380,"zeMemFree",&local_5cf);
  std::__cxx11::string::string(local_360,"zeMemFreeExt",&local_5d0);
  __l_20._M_len = 2;
  __l_20._M_array = &local_380;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a8,__l_20,&local_5d1);
  __l_21._M_len = 0xb;
  __l_21._M_array = &local_2a0;
  std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>::
  vector(in_RDI,__l_21,&local_5d2);
  lVar1 = 0x1e0;
  do {
    ctorsAndDtors::~ctorsAndDtors
              ((ctorsAndDtors *)
               ((long)&local_2a0.ctors.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_380._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_90._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_560);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_340._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4c0);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_300._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  return in_RDI;
}

Assistant:

static std::vector<ctorsAndDtors> createDestroySet() {
        return {
            {{"zeContextCreate"}, {"zeContextDestroy"}},
            {{"zeCommandQueueCreate"}, {"zeCommandQueueDestroy"}},
            {{"zeModuleCreate"}, {"zeModuleDestroy"}},
            {{"zeKernelCreate"}, {"zeKernelDestroy"}},
            {{"zeEventPoolCreate"}, {"zeEventPoolDestroy"}},
            {{"zeCommandListCreateImmediate", "zeCommandListCreate"}, {"zeCommandListDestroy"}},
            {{"zeEventCreate"}, {"zeEventDestroy"}},
            {{"zeFenceCreate"}, {"zeFenceDestroy"}},
            {{"zeImageCreate", "zeImageViewCreateExt"}, {"zeImageDestroy"}},
            {{"zeSamplerCreate"}, {"zeSamplerDestroy"}},
            {{"zeMemAllocDevice", "zeMemAllocHost", "zeMemAllocShared"}, {"zeMemFree", "zeMemFreeExt"}}
        };
    }